

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void pulse_prog_cimar_babies(OBJ_DATA *obj,bool isTick)

{
  CHAR_DATA *ch;
  bool bVar1;
  int iVar2;
  
  ch = obj->carried_by;
  if (ch != (CHAR_DATA *)0x0) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      iVar2 = number_percent();
      if (0x62 < iVar2) {
        bVar1 = is_affected_obj(obj,(int)gsn_bash);
        if (!bVar1) {
          act("$p begins wailing, its squalling face turning bright red.",ch,obj,(void *)0x0,3);
          act("$n\'s baby begins wailing...",ch,obj,(void *)0x0,0);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_cimar_babies(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *ch = obj->carried_by;

	if (ch == nullptr || is_npc(ch))
		return;

	if (number_percent() <= 98 || is_affected_obj(obj, gsn_bash))
		return;

	act("$p begins wailing, its squalling face turning bright red.", ch, obj, 0, TO_CHAR);
	act("$n's baby begins wailing...", ch, obj, 0, TO_ROOM);
}